

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ParmParse.cpp
# Opt level: O1

void amrex::anon_unknown_12::bldTable
               (char **str,
               list<amrex::ParmParse::PP_entry,_std::allocator<amrex::ParmParse::PP_entry>_> *tab)

{
  size_t *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char cVar3;
  byte bVar4;
  bool bVar5;
  list<amrex::ParmParse::PP_entry,_std::allocator<amrex::ParmParse::PP_entry>_> *tab_00;
  int iVar6;
  _Node *p_Var7;
  ostream *poVar8;
  _Node *p_Var9;
  char *pcVar10;
  undefined4 unaff_EBP;
  string tokname;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cur_list;
  string cur_name;
  Table cur_table;
  string tmp_str;
  string msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f0;
  string local_d8;
  _List_base<amrex::ParmParse::PP_entry,_std::allocator<amrex::ParmParse::PP_entry>_> local_b8;
  undefined1 *local_a0;
  undefined8 local_98;
  undefined1 local_90;
  undefined7 uStack_8f;
  PP_entry local_80;
  list<amrex::ParmParse::PP_entry,_std::allocator<amrex::ParmParse::PP_entry>_> *local_38;
  
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  local_d8._M_string_length = 0;
  local_d8.field_2._M_local_buf[0] = '\0';
  local_f0._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_f0;
  local_f0._M_impl._M_node._M_size = 0;
  local_b8._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_b8;
  local_b8._M_impl._M_node._M_size = 0;
  local_a0 = &local_90;
  local_98 = 0;
  local_90 = 0;
  local_f0._M_impl._M_node.super__List_node_base._M_prev =
       local_f0._M_impl._M_node.super__List_node_base._M_next;
  local_b8._M_impl._M_node.super__List_node_base._M_prev =
       local_b8._M_impl._M_node.super__List_node_base._M_next;
  local_38 = tab;
  do {
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    local_110._M_string_length = 0;
    local_110.field_2._M_local_buf[0] = '\0';
    pcVar10 = *str;
    while( true ) {
      while (cVar3 = *pcVar10, cVar3 == '#') {
        while ((*pcVar10 != '\0' && (*pcVar10 != '\n'))) {
          pcVar10 = pcVar10 + 1;
          *str = pcVar10;
        }
      }
      if ((cVar3 == '\0') || (iVar6 = isspace((int)cVar3), iVar6 == 0)) break;
      pcVar10 = pcVar10 + 1;
      *str = pcVar10;
    }
    if (**str == '\0') {
      unaff_EBP = 5;
    }
    else {
      do {
        bVar4 = **str;
        if (bVar4 == 0) {
          Error_host("ParmParse::getToken: EOF while parsing");
        }
        if (bVar4 < 0x3d) {
          if (bVar4 == 0x22) {
            *str = *str + 1;
            bVar5 = true;
          }
          else if (bVar4 == 0x28) {
            std::__cxx11::string::push_back((char)&local_110);
            *str = *str + 1;
            bVar5 = true;
          }
          else {
LAB_00446800:
            iVar6 = isalpha((int)(char)bVar4);
            if (iVar6 == 0) {
              std::__cxx11::string::push_back((char)&local_110);
              *str = *str + 1;
              bVar5 = true;
            }
            else {
              std::__cxx11::string::push_back((char)&local_110);
              *str = *str + 1;
              bVar5 = true;
            }
          }
        }
        else {
          if (bVar4 == 0x7d) {
            *str = *str + 1;
            unaff_EBP = 4;
          }
          else if (bVar4 == 0x7b) {
            *str = *str + 1;
            unaff_EBP = 3;
          }
          else {
            if (bVar4 != 0x3d) goto LAB_00446800;
            std::__cxx11::string::push_back((char)&local_110);
            *str = *str + 1;
            unaff_EBP = 2;
          }
          bVar5 = false;
        }
      } while (bVar5);
    }
    tab_00 = local_38;
    switch(unaff_EBP) {
    case 0:
      if (local_d8._M_string_length != 0) goto switchD_0044689b_caseD_1;
LAB_004469ac:
      std::__cxx11::string::_M_assign((string *)&local_d8);
      break;
    case 1:
switchD_0044689b_caseD_1:
      if (local_d8._M_string_length == 0) {
        local_80.m_name._M_dataplus._M_p = (pointer)&local_80.m_name.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_80,"ParmParse::bldTable(): value with no defn: ","");
        std::__cxx11::string::_M_append((char *)&local_80,(ulong)local_110._M_dataplus._M_p);
        Abort_host(local_80.m_name._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80.m_name._M_dataplus._M_p != &local_80.m_name.field_2) {
          operator_delete(local_80.m_name._M_dataplus._M_p,
                          CONCAT71(local_80.m_name.field_2._M_allocated_capacity._1_7_,
                                   local_80.m_name.field_2._M_local_buf[0]) + 1);
        }
      }
      p_Var7 = std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
               _M_create_node<std::__cxx11::string_const&>
                         ((list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                          &local_f0,&local_110);
      std::__detail::_List_node_base::_M_hook(&p_Var7->super__List_node_base);
      local_f0._M_impl._M_node._M_size = local_f0._M_impl._M_node._M_size + 1;
      break;
    case 2:
      if (local_d8._M_string_length == 0) {
        Abort_host("ParmParse::bldTable() EQ with no current defn");
      }
      if (local_f0._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_f0) {
        std::__cxx11::string::_M_assign((string *)&local_a0);
        std::__cxx11::
        list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_erase((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_f0,(iterator)local_f0._M_impl._M_node.super__List_node_base._M_prev);
        addDefn(&local_d8,
                (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_f0,tab_00);
        goto LAB_004469ac;
      }
      break;
    case 3:
      if (local_d8._M_string_length == 0) {
        Abort_host("ParmParse::bldTabe() \'{\' with no blocknamne");
      }
      if (local_f0._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_f0) {
        std::__cxx11::string::_M_assign((string *)&local_a0);
        std::__cxx11::
        list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_erase((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_f0,(iterator)local_f0._M_impl._M_node.super__List_node_base._M_prev);
        addDefn(&local_d8,
                (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_f0,tab_00);
        std::__cxx11::string::_M_assign((string *)&local_d8);
      }
      bldTable(str,(list<amrex::ParmParse::PP_entry,_std::allocator<amrex::ParmParse::PP_entry>_> *)
                   &local_b8);
      if (local_d8._M_string_length == 0) {
        std::__cxx11::
        _List_base<amrex::ParmParse::PP_entry,_std::allocator<amrex::ParmParse::PP_entry>_>::
        _M_clear(&local_b8);
        local_b8._M_impl._M_node._M_size = 0;
        local_b8._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_b8;
        local_b8._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_b8;
      }
      else {
        if (local_b8._M_impl._M_node.super__List_node_base._M_next == (_List_node_base *)&local_b8)
        {
          poVar8 = ErrorStream();
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8,"ParmParse::addTable(): no values for Table ",0x2b);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,local_d8._M_dataplus._M_p,local_d8._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
          Abort_host((char *)0x0);
        }
        ParmParse::PP_entry::PP_entry
                  (&local_80,&local_d8,
                   (list<amrex::ParmParse::PP_entry,_std::allocator<amrex::ParmParse::PP_entry>_> *)
                   &local_b8);
        p_Var9 = std::__cxx11::
                 list<amrex::ParmParse::PP_entry,_std::allocator<amrex::ParmParse::PP_entry>_>::
                 _M_create_node<amrex::ParmParse::PP_entry>(tab_00,&local_80);
        std::__detail::_List_node_base::_M_hook(&p_Var9->super__List_node_base);
        psVar1 = &(tab_00->
                  super__List_base<amrex::ParmParse::PP_entry,_std::allocator<amrex::ParmParse::PP_entry>_>
                  )._M_impl._M_node._M_size;
        *psVar1 = *psVar1 + 1;
        ParmParse::PP_entry::~PP_entry(&local_80);
        std::__cxx11::
        _List_base<amrex::ParmParse::PP_entry,_std::allocator<amrex::ParmParse::PP_entry>_>::
        _M_clear(&local_b8);
        local_b8._M_impl._M_node._M_size = 0;
        paVar2 = &local_80.m_name.field_2;
        local_80.m_name._M_string_length = 0;
        local_80.m_name.field_2._M_local_buf[0] = '\0';
        local_b8._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_b8;
        local_b8._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_b8;
        local_80.m_name._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::operator=((string *)&local_d8,(string *)&local_80);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80.m_name._M_dataplus._M_p != paVar2) {
          operator_delete(local_80.m_name._M_dataplus._M_p,
                          CONCAT71(local_80.m_name.field_2._M_allocated_capacity._1_7_,
                                   local_80.m_name.field_2._M_local_buf[0]) + 1);
        }
      }
      break;
    case 4:
      if ((local_d8._M_string_length != 0) &&
         (local_f0._M_impl._M_node.super__List_node_base._M_next == (_List_node_base *)&local_f0)) {
        Abort_host("ParmParse::bldTable() defn with no list");
      }
    case 5:
      addDefn(&local_d8,
              (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_f0,tab_00);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p,
                        CONCAT71(local_110.field_2._M_allocated_capacity._1_7_,
                                 local_110.field_2._M_local_buf[0]) + 1);
      }
      if (local_a0 != &local_90) {
        operator_delete(local_a0,CONCAT71(uStack_8f,local_90) + 1);
      }
      std::__cxx11::
      _List_base<amrex::ParmParse::PP_entry,_std::allocator<amrex::ParmParse::PP_entry>_>::_M_clear
                (&local_b8);
      std::__cxx11::
      _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_clear(&local_f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p,
                        CONCAT71(local_d8.field_2._M_allocated_capacity._1_7_,
                                 local_d8.field_2._M_local_buf[0]) + 1);
      }
      return;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p,
                      CONCAT71(local_110.field_2._M_allocated_capacity._1_7_,
                               local_110.field_2._M_local_buf[0]) + 1);
    }
  } while( true );
}

Assistant:

void
bldTable (const char*&                    str,
          std::list<ParmParse::PP_entry>& tab)
{
    std::string            cur_name;
    std::list<std::string> cur_list;
    ParmParse::Table       cur_table;
    std::string            tmp_str;

    for (;;)
    {
        std::string tokname;

        PType token = getToken(str,tokname);

        switch (token)
        {
        case pCloseBracket:
            if ( !cur_name.empty() && cur_list.empty() )
            {
                amrex::Abort("ParmParse::bldTable() defn with no list");
            }
            AMREX_FALLTHROUGH;
        case pEOF:
            addDefn(cur_name,cur_list,tab);
            return;
        case pOpenBracket:
            if ( cur_name.empty() )
            {
                amrex::Abort("ParmParse::bldTabe() '{' with no blocknamne");
            }
            if ( !cur_list.empty() )
            {
                tmp_str = cur_list.back();
                cur_list.pop_back();
                addDefn(cur_name, cur_list, tab);
                cur_name = tmp_str;
            }
            bldTable(str, cur_table);
            addTable(cur_name, cur_table, tab);
            break;
        case pEQ_sign:
            if ( cur_name.empty() )
            {
                amrex::Abort("ParmParse::bldTable() EQ with no current defn");
            }
            if ( !cur_list.empty() )
            {
                tmp_str = cur_list.back();
                cur_list.pop_back();
                addDefn(cur_name,cur_list,tab);
                cur_name = tmp_str;
            }
            //
            // Read one too far, remove last name on list.
            //
            break;
        case pDefn:
            if ( cur_name.empty() )
            {
                cur_name = tokname;
                break;
            }
            //
            // Otherwise, fall through, this may be a string.
            //
            AMREX_FALLTHROUGH;
        case pValue:
            if ( cur_name.empty() )
            {
                std::string msg("ParmParse::bldTable(): value with no defn: ");
                msg += tokname;
                amrex::Abort(msg.c_str());
            }
            cur_list.push_back(tokname);
            break;
        }
    }
}